

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

LispPTR COM_next_file(LispPTR *args)

{
  LispPTR LVar1;
  LispPTR LVar2;
  FINFO *pFVar3;
  FPROP *pFVar4;
  int iVar5;
  LispPTR *pLVar6;
  DFINFO *pDVar7;
  LispPTR *pLVar8;
  ulong local_90;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  LispPTR *lf_naddress_1;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  LispPTR *lf_naddress;
  uint propp;
  int finfoid;
  UFSGFS *gfsp;
  DFINFO *dfp;
  char *base;
  FINFO *fp;
  FPROP *pp;
  LispPTR laddr;
  LispPTR *args_local;
  
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 == 0) {
    Lisp_errno = &Dummy_errno;
    pLVar6 = NativeAligned4FromLAddr(*args);
    LVar1 = *pLVar6;
    if (((int)LVar1 < 0) || (MAXFINFO + -1 < (int)LVar1)) {
      args_local._4_4_ = 0xfffff;
    }
    else {
      LVar2 = pLVar6[4];
      pDVar7 = FinfoArray + (int)LVar1;
      pFVar3 = pDVar7->next;
      if ((pDVar7->head == (FINFO *)0x0) || (pFVar3 == (FINFO *)0x0)) {
        args_local._4_4_ = 0xfffff;
      }
      else {
        pDVar7->next = pFVar3->next;
        pLVar8 = NativeAligned4FromLAddr(pLVar6[7]);
        lf_i = (size_t)NativeAligned2FromLAddr(*pLVar8 & 0xfffffff);
        lf_dptr = pFVar3->lname;
        for (lf_naddress_1 = (LispPTR *)0x0; lf_naddress_1 < (LispPTR *)pFVar3->lname_len;
            lf_naddress_1 = (LispPTR *)((long)lf_naddress_1 + 1)) {
          *(char *)(lf_i ^ 3) = *lf_dptr;
          lf_i = lf_i + 1;
          lf_dptr = lf_dptr + 1;
        }
        if ((int)LVar2 < 0) {
          pFVar4 = pFVar3->prop;
          pLVar6[8] = pFVar4->length;
          pLVar6[9] = pFVar4->wdate;
          pLVar6[10] = pFVar4->rdate;
          pLVar6[0xb] = pFVar4->protect;
          pLVar8 = NativeAligned4FromLAddr(pLVar6[0xc]);
          lf_i_1 = (size_t)NativeAligned2FromLAddr(*pLVar8 & 0xfffffff);
          lf_dptr_1 = pFVar4->author;
          for (local_90 = 0; local_90 < pFVar4->au_len; local_90 = local_90 + 1) {
            *(char *)(lf_i_1 ^ 3) = *lf_dptr_1;
            lf_i_1 = lf_i_1 + 1;
            lf_dptr_1 = lf_dptr_1 + 1;
          }
          pLVar6[0xd] = (LispPTR)pFVar4->au_len;
          args_local._4_4_ = GetPosSmallp(pFVar3->lname_len);
        }
        else {
          args_local._4_4_ = GetPosSmallp(pFVar3->lname_len);
        }
      }
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0xfffff;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR COM_next_file(LispPTR *args)
{
  LispPTR laddr;
  FPROP *pp;
  FINFO *fp;
  char *base;
  DFINFO *dfp;
  UFSGFS *gfsp;
  int finfoid;
  unsigned propp;

  ERRSETJMP(SMALLP_MINUSONE);
  Lisp_errno = &Dummy_errno;

  gfsp = (UFSGFS *)(NativeAligned4FromLAddr(args[0]));

  finfoid = (int)gfsp->finfoid;

  if (finfoid < 0 || MAXFINFO - 1 < finfoid) return (SMALLP_MINUSONE);

  propp = gfsp->propp;

  dfp = &FinfoArray[finfoid];
  fp = dfp->next;
  if (dfp->head == NULL || fp == NULL) return (SMALLP_MINUSONE);
  dfp->next = fp->next;

  laddr = gfsp->name;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, fp->lname, fp->lname_len);
#else
  StrNCpyFromCToLisp(base, fp->lname, fp->lname_len);
#endif /* BYTESWAP	 */

  if (!propp) return (GetPosSmallp(fp->lname_len));

  pp = fp->prop;
  gfsp->length = pp->length;
  gfsp->wdate = pp->wdate;
  gfsp->rdate = pp->rdate;
  gfsp->protection = pp->protect;

  laddr = gfsp->author;
  STRING_BASE(laddr, base);
#ifndef BYTESWAP
  strncpy(base, pp->author, pp->au_len);
#else
  StrNCpyFromCToLisp(base, pp->author, pp->au_len);
#endif /* BYTESWAP	 */

  gfsp->aulen = pp->au_len;

  return (GetPosSmallp(fp->lname_len));
}